

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_Exception2_Test::Body(iu_AssertionTest_x_iutest_x_Exception2_Test *this)

{
  bool bVar1;
  AssertionHelper local_208;
  Fixed local_1d8;
  exception *anon_var_0;
  char *local_40;
  char *msg;
  undefined1 local_28 [8];
  vector<int,_std::allocator<int>_> a;
  iu_AssertionTest_x_iutest_x_Exception2_Test *this_local;
  
  a.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_28);
  iutest::detail::AlwaysZero();
  local_40 = "";
  bVar1 = iutest::detail::AlwaysTrue();
  if (bVar1) {
    exception_test::exception_test
              ((exception_test *)((long)&anon_var_0 + 7),
               (vector<int,_std::allocator<int>_> *)local_28);
  }
  local_40 = 
  "\nExpected: exception_test(a) throws an exception of type ::std::exception.\n  Actual: it throws nothing."
  ;
  memset(&local_1d8,0,0x188);
  iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
  iutest::AssertionHelper::AssertionHelper
            (&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/samples/exception.cpp"
             ,0x45,local_40,kFatalFailure);
  iutest::AssertionHelper::operator=(&local_208,&local_1d8);
  iutest::AssertionHelper::~AssertionHelper(&local_208);
  iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  anon_var_0._0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_28);
  return;
}

Assistant:

IUTEST(AssertionTest, Exception2)
{
    ::std::vector<int> a;
    IUTEST_ASSERT_THROW(exception_test(a), ::std::exception);
}